

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     )

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint in_ECX;
  int *in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar6;
  int curr_length_1;
  int curr_length;
  uint32_t max_base_position;
  int length_max;
  int min_pos;
  uint32_t best_argb;
  uint32_t best_distance;
  int best_length;
  int iter;
  uint32_t *argb_start;
  int max_len;
  uint32_t len;
  uint32_t tmp [2];
  int argb_comp_next;
  uint32_t hash_code;
  int32_t *chain;
  int32_t *hash_to_first_index;
  uint32_t base_position;
  int argb_comp;
  int pos;
  uint32_t window_size;
  int iter_max;
  int size;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int iVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffff54;
  int iVar9;
  uint64_t in_stack_ffffffffffffff58;
  uint32_t *array1;
  uint local_94;
  uint32_t local_88;
  uint local_84;
  uint local_80;
  int local_7c;
  uint local_6c;
  uint32_t local_68;
  uint local_64;
  uint local_60;
  uint32_t local_5c;
  long local_58;
  uint32_t *local_50;
  uint local_44;
  uint local_40;
  uint32_t local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  uint local_24;
  int *local_20;
  int local_14;
  long *local_10;
  int local_4;
  
  local_30 = in_ECX * in_R8D;
  local_2c = in_R9D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_34 = GetMaxItersForQuality(in_ESI);
  local_38 = GetWindowSizeForHashChain(local_14,local_24);
  local_58 = *local_10;
  if (local_30 < 3) {
    *(undefined4 *)(*local_10 + (long)(local_30 + -1) * 4) = 0;
    *(undefined4 *)*local_10 = 0;
    local_4 = 1;
  }
  else {
    local_50 = (uint32_t *)
               WebPSafeMalloc(in_stack_ffffffffffffff58,
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (local_50 == (uint32_t *)0x0) {
      local_4 = 0;
    }
    else {
      memset(local_50,0xff,0x100000);
      local_40 = (uint)(*local_20 == local_20[1]);
      local_3c = 0;
      while ((int)local_3c < local_30 + -2) {
        local_60 = (uint)(local_20[(int)(local_3c + 1)] == local_20[(int)(local_3c + 2)]);
        if ((local_40 == 0) || (local_60 == 0)) {
          local_5c = GetPixPairHash64((uint32_t *)(local_20 + (int)local_3c));
          *(uint32_t *)(local_58 + (long)(int)local_3c * 4) = local_50[local_5c];
          local_50[local_5c] = local_3c;
          local_40 = local_60;
          local_3c = local_3c + 1;
        }
        else {
          local_6c = 1;
          local_68 = local_20[(int)local_3c];
          while( true ) {
            bVar6 = false;
            if ((int)(local_3c + local_6c + 2) < local_30) {
              bVar6 = local_20[local_3c + local_6c + 2] == local_20[(int)local_3c];
            }
            if (!bVar6) break;
            local_6c = local_6c + 1;
          }
          if (0xfff < local_6c) {
            memset((void *)(local_58 + (long)(int)local_3c * 4),0xff,(ulong)(local_6c - 0xfff) << 2)
            ;
            local_3c = (local_6c - 0xfff) + local_3c;
            local_6c = 0xfff;
          }
          while (local_6c != 0) {
            local_64 = local_6c;
            local_5c = GetPixPairHash64(&local_68);
            *(uint32_t *)(local_58 + (long)(int)local_3c * 4) = local_50[local_5c];
            local_50[local_5c] = local_3c;
            local_6c = local_6c - 1;
            local_3c = local_3c + 1;
          }
          local_40 = 0;
        }
      }
      array1 = local_50;
      uVar1 = GetPixPairHash64((uint32_t *)(local_20 + (int)local_3c));
      *(uint32_t *)(local_58 + (long)(int)local_3c * 4) = array1[uVar1];
      WebPSafeFree((void *)0x1868f0);
      *(undefined4 *)(*local_10 + (long)(local_30 + -1) * 4) = 0;
      *(undefined4 *)*local_10 = 0;
      uVar4 = local_30 - 2;
      while (local_44 = uVar4, local_44 != 0) {
        iVar2 = MaxFindCopyLength((local_30 + -1) - local_44);
        local_7c = local_34;
        puVar5 = (uint32_t *)(local_20 + local_44);
        local_80 = 0;
        local_84 = 0;
        if (local_38 < local_44) {
          iVar3 = local_44 - local_38;
        }
        else {
          iVar3 = 0;
        }
        iVar7 = iVar2;
        if (0xff < iVar2) {
          iVar7 = 0x100;
        }
        local_3c = *(uint32_t *)(local_58 + (ulong)local_44 * 4);
        if (local_2c == 0) {
          iVar8 = iVar7;
          iVar9 = iVar3;
          if (local_24 <= local_44) {
            uVar4 = FindMatchLength(array1,(uint32_t *)CONCAT44(iVar3,iVar7),
                                    in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
            if (0 < (int)uVar4) {
              local_84 = local_24;
              local_80 = uVar4;
            }
            local_7c = local_7c + -1;
          }
          uVar4 = FindMatchLength(array1,(uint32_t *)CONCAT44(iVar9,iVar8),in_stack_ffffffffffffff4c
                                  ,in_stack_ffffffffffffff48);
          if ((int)local_80 < (int)uVar4) {
            local_84 = 1;
            local_80 = uVar4;
          }
          local_7c = local_7c + -1;
          if (local_80 == 0xfff) {
            local_3c = iVar3 - 1;
          }
        }
        local_88 = puVar5[(int)local_80];
        while( true ) {
          uVar4 = in_stack_ffffffffffffff4c & 0xffffff;
          if (iVar3 <= (int)local_3c) {
            local_7c = local_7c + -1;
            uVar4 = CONCAT13(local_7c != 0,(int3)in_stack_ffffffffffffff4c);
          }
          in_stack_ffffffffffffff4c = uVar4;
          if ((char)(in_stack_ffffffffffffff4c >> 0x18) == '\0') break;
          if ((local_20[(int)(local_3c + local_80)] == local_88) &&
             (uVar4 = (*VP8LVectorMismatch)((uint32_t *)(local_20 + (int)local_3c),puVar5,iVar2),
             (int)local_80 < (int)uVar4)) {
            local_84 = local_44 - local_3c;
            local_88 = puVar5[(int)uVar4];
            local_80 = uVar4;
            if (iVar7 <= (int)uVar4) break;
          }
          local_3c = *(uint32_t *)(local_58 + (long)(int)local_3c * 4);
        }
        local_94 = local_44;
        while( true ) {
          *(uint *)(*local_10 + (ulong)local_44 * 4) = local_84 << 0xc | local_80;
          uVar4 = local_44 - 1;
          if ((((local_84 == 0) || (uVar4 == 0)) || (uVar4 < local_84)) ||
             ((local_20[uVar4 - local_84] != local_20[uVar4] ||
              (((local_80 == 0xfff && (local_84 != 1)) && (local_44 + 0xffe < local_94)))))) break;
          local_44 = uVar4;
          if ((int)local_80 < 0xfff) {
            local_80 = local_80 + 1;
            local_94 = uVar4;
          }
        }
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length_ as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length_;
  assert(size > 0);
  assert(p->size_ != 0);
  assert(p->offset_length_ != NULL);

  if (size <= 2) {
    p->offset_length_[0] = p->offset_length_[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) return 0;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length_[0] = p->offset_length_[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length_[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }
  }
  return 1;
}